

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

MP<135UL,_GF2::MOLex<135UL>_> * __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::operator%=
          (MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  bool bVar1;
  iterator __position;
  
  __position._M_node =
       (this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
       super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  while (__position._M_node != (_List_node_base *)this) {
    bVar1 = MM<135UL>::IsDivisibleBy((MM<135UL> *)(__position._M_node + 1),mRight);
    if (bVar1) {
      __position = std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::erase
                             (&this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>,
                              __position._M_node);
    }
    else {
      __position._M_node = (__position._M_node)->_M_next;
    }
  }
  return this;
}

Assistant:

MP& operator%=(const MM<_n>& mRight)
	{	
		for (iterator iter = begin(); iter != end();)
			if (iter->IsDivisibleBy(mRight)) 
				iter = erase(iter);
			else ++iter;
		return *this;
	}